

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QMetaTypeInterface ** __thiscall
QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator[]
          (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *this,QByteArray *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::tryEmplace_impl<QByteArray_const&>
            (&local_28,(QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *)this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QMetaTypeInterface **)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 0x18);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }